

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resource.cpp
# Opt level: O3

void std::pmr::formatBlock(void *address,size_t length)

{
  byte *pbVar1;
  uint uVar2;
  byte *addr;
  uint uVar3;
  
  if (0 < (long)length) {
    pbVar1 = (byte *)(length + (long)address);
    uVar2 = 0;
    do {
      if ((uVar2 & 3) == 0) {
        if (uVar2 != 0) {
          putchar(10);
        }
        printf("%p:\t",address);
      }
      else {
        printf("  ");
      }
      if (address < pbVar1) {
        uVar3 = 0;
        do {
          printf("%02x ",(ulong)*address);
          address = (void *)((long)address + 1);
          if (2 < uVar3) break;
          uVar3 = uVar3 + 1;
        } while (address < pbVar1);
      }
      uVar2 = uVar2 + 1;
    } while (address < pbVar1);
  }
  putchar(10);
  return;
}

Assistant:

static
void formatBlock(void *address, std::size_t length)
    // Format in hex to 'stdout', a block of memory starting at the specified
    // starting 'address' of the specified 'length' (in bytes).  Each line of
    // formatted output will have a maximum of 16 bytes per line, where each
    // line starts with the address of that 16-byte chunk.
{
    byte *addr    = reinterpret_cast<byte *>(address);
    byte *endAddr = addr + length;

    for (int i = 0; addr < endAddr; ++i) {
        if (0 == i % 4) {
            if (i) {
                printf("\n");
            }
            printf("%p:\t", static_cast<void *>(addr));
        }
        else {
            printf("  ");
        }

        for (int j = 0; j < 4 && addr < endAddr; ++j) {
            printf("%02x ", *addr);
            ++addr;
        }
    }

    printf("\n");
}